

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VtabSavepoint(sqlite3 *db,int op,int iSavepoint)

{
  VTable *pVTab;
  sqlite3_vtab *psVar1;
  sqlite3_module *psVar2;
  ulong uVar3;
  int iVar4;
  _func_int_sqlite3_vtab_ptr_int *p_Var5;
  int i;
  long lVar6;
  
  if (db->aVTrans == (VTable **)0x0) {
LAB_001438ff:
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    do {
      if (db->nVTrans <= lVar6) goto LAB_001438ff;
      pVTab = db->aVTrans[lVar6];
      psVar1 = pVTab->pVtab;
      iVar4 = 0;
      if ((psVar1 != (sqlite3_vtab *)0x0) && (psVar2 = pVTab->pMod->pModule, 1 < psVar2->iVersion))
      {
        pVTab->nRef = pVTab->nRef + 1;
        if (op == 2) {
          p_Var5 = psVar2->xRollbackTo;
        }
        else if (op == 0) {
          p_Var5 = psVar2->xSavepoint;
          pVTab->iSavepoint = iSavepoint + 1;
        }
        else {
          p_Var5 = psVar2->xRelease;
        }
        iVar4 = 0;
        if ((p_Var5 != (_func_int_sqlite3_vtab_ptr_int *)0x0) && (iSavepoint < pVTab->iSavepoint)) {
          uVar3 = db->flags;
          db->flags = uVar3 & 0xffffffffefffffff;
          iVar4 = (*p_Var5)(psVar1,iSavepoint);
          db->flags = db->flags | (ulong)((uint)uVar3 & 0x10000000);
        }
        sqlite3VtabUnlock(pVTab);
      }
      lVar6 = lVar6 + 1;
    } while (iVar4 == 0);
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VtabSavepoint(sqlite3 *db, int op, int iSavepoint){
  int rc = SQLITE_OK;

  assert( op==SAVEPOINT_RELEASE||op==SAVEPOINT_ROLLBACK||op==SAVEPOINT_BEGIN );
  assert( iSavepoint>=-1 );
  if( db->aVTrans ){
    int i;
    for(i=0; rc==SQLITE_OK && i<db->nVTrans; i++){
      VTable *pVTab = db->aVTrans[i];
      const sqlite3_module *pMod = pVTab->pMod->pModule;
      if( pVTab->pVtab && pMod->iVersion>=2 ){
        int (*xMethod)(sqlite3_vtab *, int);
        sqlite3VtabLock(pVTab);
        switch( op ){
          case SAVEPOINT_BEGIN:
            xMethod = pMod->xSavepoint;
            pVTab->iSavepoint = iSavepoint+1;
            break;
          case SAVEPOINT_ROLLBACK:
            xMethod = pMod->xRollbackTo;
            break;
          default:
            xMethod = pMod->xRelease;
            break;
        }
        if( xMethod && pVTab->iSavepoint>iSavepoint ){
          u64 savedFlags = (db->flags & SQLITE_Defensive);
          db->flags &= ~(u64)SQLITE_Defensive;
          rc = xMethod(pVTab->pVtab, iSavepoint);
          db->flags |= savedFlags;
        }
        sqlite3VtabUnlock(pVTab);
      }
    }
  }
  return rc;
}